

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

uint64_t SharpYUVUpdateY_SSE2(uint16_t *ref,uint16_t *src,uint16_t *dst,int len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  uint16_t uVar10;
  int iVar11;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar12 [16];
  int new_y;
  int diff_y;
  __m128i I;
  __m128i H;
  __m128i G;
  __m128i F;
  __m128i E;
  __m128i D;
  __m128i C;
  __m128i B;
  __m128i A;
  __m128i sum;
  __m128i one;
  __m128i max;
  __m128i zero;
  int i;
  uint32_t tmp [4];
  uint64_t diff;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_1fc;
  undefined1 local_1f8 [16];
  ulong local_1e8;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  undefined2 local_1bc;
  undefined2 local_1ba;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined2 local_1a8;
  undefined2 local_1a6;
  undefined2 local_1a4;
  undefined2 local_1a2;
  undefined2 local_1a0;
  undefined2 local_19e;
  undefined2 local_19c;
  undefined2 local_19a;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined2 local_188;
  undefined2 local_186;
  undefined2 local_184;
  undefined2 local_182;
  undefined2 local_180;
  undefined2 local_17e;
  undefined2 local_17c;
  undefined2 local_17a;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  ulong local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ushort local_38;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  ushort uStack_30;
  ushort uStack_2e;
  ushort uStack_2c;
  ushort uStack_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_178 = 0;
  uStack_170 = 0;
  local_1ba = 0x3ff;
  local_19a = 0x3ff;
  local_19c = 0x3ff;
  local_19e = 0x3ff;
  local_1a0 = 0x3ff;
  local_1a2 = 0x3ff;
  local_1a4 = 0x3ff;
  local_1a6 = 0x3ff;
  local_1a8 = 0x3ff;
  local_1b8 = 0x3ff03ff03ff03ff;
  uStack_1b0 = 0x3ff03ff03ff03ff;
  local_1bc = 1;
  local_17a = 1;
  local_17c = 1;
  local_17e = 1;
  local_180 = 1;
  local_182 = 1;
  local_184 = 1;
  local_186 = 1;
  local_188 = 1;
  local_198 = 0x1000100010001;
  uStack_190 = 0x1000100010001;
  local_248 = 0;
  uStack_240 = 0;
  for (local_1fc = 0; uVar2 = uStack_70, uVar1 = local_78, local_78._0_4_ = (int)local_248,
      local_78._4_4_ = (int)((ulong)local_248 >> 0x20), uStack_70._0_4_ = (int)uStack_240,
      uStack_70._4_4_ = (int)((ulong)uStack_240 >> 0x20), local_1fc + 8 <= in_ECX;
      local_1fc = local_1fc + 8) {
    local_b0 = (undefined8 *)(in_RDI + (long)local_1fc * 2);
    uVar1 = *local_b0;
    uVar2 = local_b0[1];
    local_b8 = (undefined8 *)(in_RSI + (long)local_1fc * 2);
    uVar3 = *local_b8;
    uVar4 = local_b8[1];
    local_c0 = (undefined8 *)(in_RDX + (long)local_1fc * 2);
    uVar5 = *local_c0;
    uVar6 = local_c0[1];
    local_158._0_2_ = (short)uVar1;
    local_158._2_2_ = (short)((ulong)uVar1 >> 0x10);
    local_158._4_2_ = (short)((ulong)uVar1 >> 0x20);
    local_158._6_2_ = (short)((ulong)uVar1 >> 0x30);
    uStack_150._0_2_ = (short)uVar2;
    uStack_150._2_2_ = (short)((ulong)uVar2 >> 0x10);
    uStack_150._4_2_ = (short)((ulong)uVar2 >> 0x20);
    uStack_150._6_2_ = (short)((ulong)uVar2 >> 0x30);
    local_168._0_2_ = (short)uVar3;
    local_168._2_2_ = (short)((ulong)uVar3 >> 0x10);
    local_168._4_2_ = (short)((ulong)uVar3 >> 0x20);
    local_168._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_160._0_2_ = (short)uVar4;
    uStack_160._2_2_ = (short)((ulong)uVar4 >> 0x10);
    uStack_160._4_2_ = (short)((ulong)uVar4 >> 0x20);
    uStack_160._6_2_ = (short)((ulong)uVar4 >> 0x30);
    local_158._0_2_ = (short)local_158 - (short)local_168;
    local_158._2_2_ = local_158._2_2_ - local_168._2_2_;
    local_158._4_2_ = local_158._4_2_ - local_168._4_2_;
    local_158._6_2_ = local_158._6_2_ - local_168._6_2_;
    uStack_150._0_2_ = (short)uStack_150 - (short)uStack_160;
    uStack_150._2_2_ = uStack_150._2_2_ - uStack_160._2_2_;
    uStack_150._4_2_ = uStack_150._4_2_ - uStack_160._4_2_;
    uStack_150._6_2_ = uStack_150._6_2_ - uStack_160._6_2_;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = CONCAT26(local_158._6_2_,
                        CONCAT24(local_158._4_2_,CONCAT22(local_158._2_2_,(short)local_158)));
    uStack_60 = CONCAT26(uStack_150._6_2_,
                         CONCAT24(uStack_150._4_2_,CONCAT22(uStack_150._2_2_,(short)uStack_150)));
    local_148 = CONCAT26(local_158._6_2_,
                         CONCAT24(local_158._4_2_,CONCAT22(local_158._2_2_,(short)local_158)));
    uStack_140 = CONCAT26(uStack_150._6_2_,
                          CONCAT24(uStack_150._4_2_,CONCAT22(uStack_150._2_2_,(short)uStack_150)));
    local_138._0_2_ = (short)uVar5;
    local_138._2_2_ = (short)((ulong)uVar5 >> 0x10);
    local_138._4_2_ = (short)((ulong)uVar5 >> 0x20);
    local_138._6_2_ = (short)((ulong)uVar5 >> 0x30);
    uStack_130._0_2_ = (short)uVar6;
    uStack_130._2_2_ = (short)((ulong)uVar6 >> 0x10);
    uStack_130._4_2_ = (short)((ulong)uVar6 >> 0x20);
    uStack_130._6_2_ = (short)((ulong)uVar6 >> 0x30);
    local_138._0_2_ = (short)local_138 + (short)local_158;
    local_138._2_2_ = local_138._2_2_ + local_158._2_2_;
    local_138._4_2_ = local_138._4_2_ + local_158._4_2_;
    local_138._6_2_ = local_138._6_2_ + local_158._6_2_;
    uStack_130._0_2_ = (short)uStack_130 + (short)uStack_150;
    uStack_130._2_2_ = uStack_130._2_2_ + uStack_150._2_2_;
    uStack_130._4_2_ = uStack_130._4_2_ + uStack_150._4_2_;
    uStack_130._6_2_ = uStack_130._6_2_ + uStack_150._6_2_;
    local_d8 = CONCAT26(-(ushort)(local_158._6_2_ < 0),
                        CONCAT24(-(ushort)(local_158._4_2_ < 0),
                                 CONCAT22(-(ushort)(local_158._2_2_ < 0),
                                          -(ushort)((short)local_158 < 0))));
    uStack_d0 = CONCAT26(-(ushort)(uStack_150._6_2_ < 0),
                         CONCAT24(-(ushort)(uStack_150._4_2_ < 0),
                                  CONCAT22(-(ushort)(uStack_150._2_2_ < 0),
                                           -(ushort)((short)uStack_150 < 0))));
    local_a8 = local_d8 | 0x1000100010001;
    uStack_a0 = uStack_d0 | 0x1000100010001;
    local_18 = CONCAT26(local_138._6_2_,
                        CONCAT24(local_138._4_2_,CONCAT22(local_138._2_2_,(short)local_138)));
    uStack_10 = CONCAT26(uStack_130._6_2_,
                         CONCAT24(uStack_130._4_2_,CONCAT22(uStack_130._2_2_,(short)uStack_130)));
    local_38 = (ushort)(0x3ff < (short)local_138) * 0x3ff |
               (ushort)(0x3ff >= (short)local_138) * (short)local_138;
    uStack_36 = (ushort)(0x3ff < local_138._2_2_) * 0x3ff |
                (ushort)(0x3ff >= local_138._2_2_) * local_138._2_2_;
    uStack_34 = (ushort)(0x3ff < local_138._4_2_) * 0x3ff |
                (ushort)(0x3ff >= local_138._4_2_) * local_138._4_2_;
    uStack_32 = (ushort)(0x3ff < local_138._6_2_) * 0x3ff |
                (ushort)(0x3ff >= local_138._6_2_) * local_138._6_2_;
    uStack_30 = (ushort)(0x3ff < (short)uStack_130) * 0x3ff |
                (ushort)(0x3ff >= (short)uStack_130) * (short)uStack_130;
    uStack_2e = (ushort)(0x3ff < uStack_130._2_2_) * 0x3ff |
                (ushort)(0x3ff >= uStack_130._2_2_) * uStack_130._2_2_;
    uStack_2c = (ushort)(0x3ff < uStack_130._4_2_) * 0x3ff |
                (ushort)(0x3ff >= uStack_130._4_2_) * uStack_130._4_2_;
    uStack_2a = (ushort)(0x3ff < uStack_130._6_2_) * 0x3ff |
                (ushort)(0x3ff >= uStack_130._6_2_) * uStack_130._6_2_;
    local_48 = 0;
    uStack_40 = 0;
    local_98 = CONCAT26(local_158._6_2_,
                        CONCAT24(local_158._4_2_,CONCAT22(local_158._2_2_,(short)local_158)));
    uStack_90 = CONCAT26(uStack_150._6_2_,
                         CONCAT24(uStack_150._4_2_,CONCAT22(uStack_150._2_2_,(short)uStack_150)));
    auVar9._8_8_ = uStack_90;
    auVar9._0_8_ = local_98;
    auVar12._8_8_ = uStack_a0;
    auVar12._0_8_ = local_a8;
    auVar12 = pmaddwd(auVar9,auVar12);
    local_f0 = (undefined8 *)(in_RDX + (long)local_1fc * 2);
    local_108 = CONCAT26((-1 < (short)uStack_32) * uStack_32,
                         CONCAT24((-1 < (short)uStack_34) * uStack_34,
                                  CONCAT22((-1 < (short)uStack_36) * uStack_36,
                                           (-1 < (short)local_38) * local_38)));
    uStack_100 = CONCAT26((-1 < (short)uStack_2a) * uStack_2a,
                          CONCAT24((-1 < (short)uStack_2c) * uStack_2c,
                                   CONCAT22((-1 < (short)uStack_2e) * uStack_2e,
                                            (-1 < (short)uStack_30) * uStack_30)));
    *local_f0 = local_108;
    local_f0[1] = uStack_100;
    uVar7 = local_248;
    uVar8 = uStack_240;
    local_2d8 = auVar12._0_8_;
    uStack_2d0 = auVar12._8_8_;
    local_88._0_4_ = auVar12._0_4_;
    local_88._4_4_ = auVar12._4_4_;
    uStack_80._0_4_ = auVar12._8_4_;
    uStack_80._4_4_ = auVar12._12_4_;
    local_248 = CONCAT44(local_78._4_4_ + local_88._4_4_,(int)local_78 + (int)local_88);
    uStack_240 = CONCAT44(uStack_70._4_4_ + uStack_80._4_4_,(int)uStack_70 + (int)uStack_80);
    local_168 = uVar3;
    uStack_160 = uVar4;
    local_158 = uVar1;
    uStack_150 = uVar2;
    local_138 = uVar5;
    uStack_130 = uVar6;
    local_e8 = local_198;
    uStack_e0 = uStack_190;
    local_88 = local_2d8;
    uStack_80 = uStack_2d0;
    local_78 = uVar7;
    uStack_70 = uVar8;
    local_28 = local_1b8;
    uStack_20 = uStack_1b0;
  }
  local_110 = local_1f8;
  local_128 = local_248;
  uStack_120 = uStack_240;
  local_1e8 = (ulong)(uint)(uStack_70._4_4_ + (int)uStack_70 + local_78._4_4_ + (int)local_78);
  local_1dc = in_ECX;
  local_1d8 = in_RDX;
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  local_78 = uVar1;
  uStack_70 = uVar2;
  for (; local_1fc < local_1dc; local_1fc = local_1fc + 1) {
    iVar11 = (uint)*(ushort *)(local_1c8 + (long)local_1fc * 2) -
             (uint)*(ushort *)(local_1d0 + (long)local_1fc * 2);
    uVar10 = clip_y((uint)*(ushort *)(local_1d8 + (long)local_1fc * 2) + iVar11);
    *(uint16_t *)(local_1d8 + (long)local_1fc * 2) = uVar10;
    if (iVar11 < 1) {
      iVar11 = -iVar11;
    }
    local_1e8 = (long)iVar11 + local_1e8;
  }
  return local_1e8;
}

Assistant:

static uint64_t SharpYUVUpdateY_SSE2(const uint16_t* ref, const uint16_t* src,
                                     uint16_t* dst, int len) {
  uint64_t diff = 0;
  uint32_t tmp[4];
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i max = _mm_set1_epi16(MAX_Y);
  const __m128i one = _mm_set1_epi16(1);
  __m128i sum = zero;

  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);       // diff_y
    const __m128i E = _mm_cmpgt_epi16(zero, D);  // sign (-1 or 0)
    const __m128i F = _mm_add_epi16(C, D);       // new_y
    const __m128i G = _mm_or_si128(E, one);      // -1 or 1
    const __m128i H = _mm_max_epi16(_mm_min_epi16(F, max), zero);
    const __m128i I = _mm_madd_epi16(D, G);      // sum(abs(...))
    _mm_storeu_si128((__m128i*)(dst + i), H);
    sum = _mm_add_epi32(sum, I);
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  diff = tmp[3] + tmp[2] + tmp[1] + tmp[0];
  for (; i < len; ++i) {
    const int diff_y = ref[i] - src[i];
    const int new_y = (int)dst[i] + diff_y;
    dst[i] = clip_y(new_y);
    diff += (uint64_t)abs(diff_y);
  }
  return diff;
}